

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op_addx_int(DisasContext_conflict8 *dc,TCGv_i32 dst,TCGv_i32 src1,TCGv_i32 src2,
                    int update_cc)

{
  uint uVar1;
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 arg;
  TCGTemp *pTVar2;
  uintptr_t o_11;
  uintptr_t o_1;
  uintptr_t o_4;
  TCGv_i32 a1;
  uintptr_t o_3;
  TCGTemp *local_38;
  
  tcg_ctx = dc->uc->tcg_ctx;
  uVar1 = dc->cc_op;
  if (uVar1 < 0xc) {
    if ((0x68U >> (uVar1 & 0x1f) & 1) != 0) {
      arg = gen_add32_carry32(tcg_ctx);
      goto LAB_00a57114;
    }
    if ((0x680U >> (uVar1 & 0x1f) & 1) != 0) {
      arg = gen_sub32_carry32(tcg_ctx);
      goto LAB_00a57114;
    }
    if ((0x804U >> (uVar1 & 0x1f) & 1) != 0) {
      if (update_cc == 0) {
        tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(dst + (long)tcg_ctx),
                            (TCGArg)(src1 + (long)tcg_ctx),(TCGArg)(src2 + (long)tcg_ctx));
        return;
      }
      if (tcg_ctx->cpu_cc_src != (TCGv_i64)src1) {
        tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_src + (long)tcg_ctx),
                            (TCGArg)(src1 + (long)tcg_ctx));
      }
      if (tcg_ctx->cpu_cc_src2 != (TCGv_i64)src2) {
        tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_src2 + (long)tcg_ctx),
                            (TCGArg)(src2 + (long)tcg_ctx));
      }
      tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)(tcg_ctx->cpu_cc_dst + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_cc_src + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_cc_src2 + (long)tcg_ctx));
      if (tcg_ctx->cpu_cc_dst == (TCGv_i64)dst) {
        return;
      }
      tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(dst + (long)tcg_ctx),
                          (TCGArg)(tcg_ctx->cpu_cc_dst + (long)tcg_ctx));
      return;
    }
  }
  pTVar2 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I32,false);
  arg = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
  local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_sparc64(tcg_ctx,helper_compute_C_icc_sparc64,pTVar2,1,&local_38);
LAB_00a57114:
  pTVar2 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_extu_i32_i64_sparc64(tcg_ctx,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),arg);
  a1 = dst + (long)tcg_ctx;
  tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)a1,(TCGArg)(src1 + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(src2 + (long)&tcg_ctx->pool_cur));
  tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_add_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)pTVar2);
  tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(arg + (long)tcg_ctx));
  tcg_temp_free_internal_sparc64(tcg_ctx,pTVar2);
  if (update_cc != 0) {
    if (tcg_ctx->cpu_cc_src != (TCGv_i64)src1) {
      tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_src + (long)tcg_ctx),
                          (TCGArg)(src1 + (long)&tcg_ctx->pool_cur));
    }
    if (tcg_ctx->cpu_cc_src2 != (TCGv_i64)src2) {
      tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_src2 + (long)tcg_ctx),
                          (TCGArg)(src2 + (long)&tcg_ctx->pool_cur));
    }
    if (tcg_ctx->cpu_cc_dst != (TCGv_i64)dst) {
      tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_dst + (long)tcg_ctx),
                          (TCGArg)a1);
    }
    tcg_gen_op2_sparc64(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(tcg_ctx->cpu_cc_op + (long)tcg_ctx),4);
    dc->cc_op = 4;
  }
  return;
}

Assistant:

static void gen_op_addx_int(DisasContext *dc, TCGv dst, TCGv src1,
                            TCGv src2, int update_cc)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i32 carry_32;
    TCGv carry;

    switch (dc->cc_op) {
    case CC_OP_DIV:
    case CC_OP_LOGIC:
        /* Carry is known to be zero.  Fall back to plain ADD.  */
        if (update_cc) {
            gen_op_add_cc(tcg_ctx, dst, src1, src2);
        } else {
            tcg_gen_add_tl(tcg_ctx, dst, src1, src2);
        }
        return;

    case CC_OP_ADD:
    case CC_OP_TADD:
    case CC_OP_TADDTV:
        if (TARGET_LONG_BITS == 32) {
            /* We can re-use the host's hardware carry generation by using
               an ADD2 opcode.  We discard the low part of the output.
               Ideally we'd combine this operation with the add that
               generated the carry in the first place.  */
            carry = tcg_temp_new(tcg_ctx);
            tcg_gen_add2_tl(tcg_ctx, carry, dst, tcg_ctx->cpu_cc_src, src1, tcg_ctx->cpu_cc_src2, src2);
            tcg_temp_free(tcg_ctx, carry);
            goto add_done;
        }
        carry_32 = gen_add32_carry32(tcg_ctx);
        break;

    case CC_OP_SUB:
    case CC_OP_TSUB:
    case CC_OP_TSUBTV:
        carry_32 = gen_sub32_carry32(tcg_ctx);
        break;

    default:
        /* We need external help to produce the carry.  */
        carry_32 = tcg_temp_new_i32(tcg_ctx);
        gen_helper_compute_C_icc(tcg_ctx, carry_32, tcg_ctx->cpu_env);
        break;
    }

#if TARGET_LONG_BITS == 64
    carry = tcg_temp_new(tcg_ctx);
    tcg_gen_extu_i32_i64(tcg_ctx, carry, carry_32);
#else
    carry = carry_32;
#endif

    tcg_gen_add_tl(tcg_ctx, dst, src1, src2);
    tcg_gen_add_tl(tcg_ctx, dst, dst, carry);

    tcg_temp_free_i32(tcg_ctx, carry_32);
#if TARGET_LONG_BITS == 64
    tcg_temp_free(tcg_ctx, carry);
#endif

 add_done:
    if (update_cc) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, src1);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src2, src2);
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, dst);
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_cc_op, CC_OP_ADDX);
        dc->cc_op = CC_OP_ADDX;
    }
}